

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpointingdevice.cpp
# Opt level: O1

void __thiscall
QPointingDevicePrivate::clearPassiveGrabbers
          (QPointingDevicePrivate *this,QPointerEvent *event,QEventPoint *point)

{
  QList<QPointer<QObject>_> *this_00;
  qsizetype *tp;
  QPointer<QObject> **debug;
  QObject *pQVar1;
  void *pvVar2;
  Data *pDVar3;
  QArrayData *pQVar4;
  QExplicitlySharedDataPointer<QEventPointPrivate> this_01;
  int t;
  iterator iVar5;
  iterator iVar6;
  QDebug *pQVar7;
  long lVar8;
  long in_FS_OFFSET;
  QByteArrayView QVar9;
  const_iterator cVar10;
  QDebug local_b8;
  QList<QPointer<QObject>_> local_b0;
  undefined1 local_98 [8];
  QString local_90;
  QExplicitlySharedDataPointer<QEventPointPrivate> local_78;
  undefined4 local_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  QExplicitlySharedDataPointer<QEventPointPrivate> *pQStack_50;
  QEventPoint *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QObject **)&(this->super_QInputDevicePrivate).field_0x8;
  local_68._0_4_ = QEventPoint::id(point);
  cVar10 = QFlatMap<int,_QPointingDevicePrivate::EventPointData,_std::less<int>,_QVarLengthArray<int,_20LL>,_QVarLengthArray<QPointingDevicePrivate::EventPointData,_20LL>_>
           ::find(&this->activePoints,(int *)&local_68);
  lVar8 = cVar10.i;
  if ((lVar8 == (this->activePoints).c.keys.super_QVLABase<int>.super_QVLABaseBase.s) ||
     (pvVar2 = (this->activePoints).c.values.super_QVLABase<QPointingDevicePrivate::EventPointData>.
               super_QVLABaseBase.ptr, pvVar2 == (void *)0x0)) {
    local_68._0_4_ = 2;
    local_68._4_4_ = 0;
    uStack_60._0_4_ = 0;
    uStack_60._4_4_ = 0;
    local_58._0_4_ = 0;
    local_58._4_4_ = 0;
    pQStack_50 = (QExplicitlySharedDataPointer<QEventPointPrivate> *)0x6b110e;
    QMessageLogger::warning();
    this_01.d.ptr = local_78.d.ptr;
    QVar9.m_data = (storage_type *)0x1c;
    QVar9.m_size = (qsizetype)&local_90;
    QString::fromUtf8(QVar9);
    QTextStream::operator<<((QTextStream *)this_01.d.ptr,&local_90);
    if (&(local_90.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (*(char *)&((QPointF *)((long)local_78.d.ptr + 0x30))->xp == '\x01') {
      QTextStream::operator<<((QTextStream *)local_78.d.ptr,' ');
    }
    tp = &local_b0.d.size;
    local_b0.d.size = (qsizetype)local_78.d.ptr;
    *(int *)&(((QList<QEventPoint> *)((long)local_78.d.ptr + 0x28))->d).d =
         *(int *)&(((QList<QEventPoint> *)((long)local_78.d.ptr + 0x28))->d).d + 1;
    ::operator<<((Stream *)local_98,(QEventPoint *)tp);
    QDebug::~QDebug((QDebug *)local_98);
    QDebug::~QDebug((QDebug *)tp);
    QDebug::~QDebug((QDebug *)&local_78);
  }
  else if (*(long *)((long)pvVar2 + lVar8 * 0x58 + 0x38) != 0) {
    this_00 = (QList<QPointer<QObject>_> *)((long)pvVar2 + lVar8 * 0x58 + 0x28);
    QtPrivateLogging::lcPointerGrab();
    if ((((byte)QtPrivateLogging::lcPointerGrab::category.field_2.bools.enabledDebug._q_value.
                _M_base._M_i & 1) != 0) &&
       (QtPrivateLogging::lcPointerGrab(),
       ((byte)QtPrivateLogging::lcPointerGrab::category.field_2.bools.enabledDebug._q_value._M_base.
              _M_i & 1) != 0)) {
      local_68._0_4_ = 2;
      local_68._4_4_ = 0;
      uStack_60._0_4_ = 0;
      uStack_60._4_4_ = 0;
      local_58._0_4_ = 0;
      local_58._4_4_ = 0;
      pQStack_50 = (QExplicitlySharedDataPointer<QEventPointPrivate> *)
                   QtPrivateLogging::lcPointerGrab::category.name;
      QMessageLogger::debug();
      pQVar7 = QDebug::operator<<((QDebug *)&local_78,&(this->super_QInputDevicePrivate).name);
      pQVar7 = QDebug::operator<<(pQVar7,"point");
      t = QEventPoint::id(point);
      pQVar7 = QDebug::operator<<(pQVar7,t);
      local_b8.stream = pQVar7->stream;
      (local_b8.stream)->ref = (local_b8.stream)->ref + 1;
      QEventPoint::state(point);
      ::operator<<((Stream *)&local_90,(State)&local_b8);
      pQVar7 = QDebug::operator<<((QDebug *)&local_90,": clearing");
      local_b0.d.d = (Data *)pQVar7->stream;
      ((Stream *)local_b0.d.d)->ref = ((Stream *)local_b0.d.d)->ref + 1;
      debug = &local_b0.d.ptr;
      ::operator<<((QDebug)debug,&local_b0);
      QDebug::~QDebug((QDebug *)debug);
      QDebug::~QDebug((QDebug *)&local_b0);
      QDebug::~QDebug((QDebug *)&local_90);
      QDebug::~QDebug(&local_b8);
      QDebug::~QDebug((QDebug *)&local_78);
    }
    iVar5 = QList<QPointer<QObject>_>::begin(this_00);
    iVar6 = QList<QPointer<QObject>_>::end(this_00);
    if (iVar5.i != iVar6.i) {
      do {
        pDVar3 = ((iVar5.i)->wp).d;
        if (pDVar3 == (Data *)0x0) {
          local_90.d.d = (Data *)(QArrayData *)0x0;
        }
        else {
          pQVar4 = (QArrayData *)((iVar5.i)->wp).value;
          LOCK();
          (pDVar3->weakref)._q_value.super___atomic_base<int>._M_i =
               (pDVar3->weakref)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
          local_90.d.d = (Data *)(QArrayData *)0x0;
          if ((pDVar3->strongref)._q_value.super___atomic_base<int>._M_i != 0) {
            local_90.d.d = (Data *)pQVar4;
          }
        }
        local_6c = 2;
        local_68._0_4_ = 0;
        local_68._4_4_ = 0;
        uStack_60 = &local_90;
        local_58 = &local_6c;
        local_78.d.ptr =
             (totally_ordered_wrapper<QEventPointPrivate_*>)
             (totally_ordered_wrapper<QEventPointPrivate_*>)event;
        pQStack_50 = &local_78;
        local_48 = point;
        QMetaObject::activate(pQVar1,&QPointingDevice::staticMetaObject,0,(void **)&local_68);
        if (pDVar3 != (Data *)0x0) {
          LOCK();
          (pDVar3->weakref)._q_value.super___atomic_base<int>._M_i =
               (pDVar3->weakref)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDVar3->weakref)._q_value.super___atomic_base<int>._M_i == 0) {
            operator_delete(pDVar3);
          }
        }
        iVar5.i = iVar5.i + 1;
      } while (iVar5.i != iVar6.i);
    }
    QList<QPointer<QObject>_>::clear(this_00);
    QList<QPointer<QObject>_>::clear
              ((QList<QPointer<QObject>_> *)((long)pvVar2 + lVar8 * 0x58 + 0x40));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPointingDevicePrivate::clearPassiveGrabbers(const QPointerEvent *event, const QEventPoint &point)
{
    Q_Q(QPointingDevice);
    auto persistentPoint = queryPointById(point.id());
    if (!persistentPoint) {
        qWarning() << "point is not in activePoints" << point;
        return;
    }
    if (persistentPoint->passiveGrabbers.isEmpty())
        return;
    if (Q_UNLIKELY(lcPointerGrab().isDebugEnabled())) {
        qCDebug(lcPointerGrab) << name << "point" << point.id() << point.state()
                               << ": clearing" << persistentPoint->passiveGrabbers;
    }
    for (auto g : persistentPoint->passiveGrabbers)
        emit q->grabChanged(g, QPointingDevice::UngrabPassive, event, point);
    persistentPoint->passiveGrabbers.clear();
    persistentPoint->passiveGrabbersContext.clear();
}